

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

t_int * line_tilde_perf8(t_int *w)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  long lVar3;
  t_int tVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  lVar5 = w[1];
  lVar3 = w[2];
  tVar4 = w[3];
  fVar8 = *(float *)(lVar5 + 0x34);
  if ((((uint)fVar8 >> 0x1d ^ (uint)fVar8 >> 0x1e) & 1) == 0) {
    *(undefined4 *)(lVar5 + 0x34) = 0;
    fVar8 = 0.0;
  }
  if (*(int *)(lVar5 + 0x54) == 0) {
    iVar6 = *(int *)(lVar5 + 0x50);
    if (iVar6 == 0) {
      uVar2 = *(undefined4 *)(lVar5 + 0x30);
      *(undefined4 *)(lVar5 + 0x34) = uVar2;
      for (lVar5 = 0; (int)tVar4 != (int)lVar5; lVar5 = lVar5 + 8) {
        puVar1 = (undefined4 *)(lVar3 + lVar5 * 4);
        *puVar1 = uVar2;
        puVar1[1] = uVar2;
        puVar1[2] = uVar2;
        puVar1[3] = uVar2;
        puVar1 = (undefined4 *)(lVar3 + 0x10 + lVar5 * 4);
        *puVar1 = uVar2;
        puVar1[1] = uVar2;
        puVar1[2] = uVar2;
        puVar1[3] = uVar2;
      }
      goto LAB_0011925d;
    }
  }
  else {
    iVar6 = (int)(*(float *)(lVar5 + 0x4c) * *(float *)(lVar5 + 0x44));
    iVar6 = iVar6 + (uint)(iVar6 == 0);
    fVar9 = (*(float *)(lVar5 + 0x30) - fVar8) / (float)iVar6;
    *(float *)(lVar5 + 0x38) = fVar9;
    *(float *)(lVar5 + 0x3c) = fVar9 * *(float *)(lVar5 + 0x40);
    *(undefined4 *)(lVar5 + 0x54) = 0;
  }
  for (lVar7 = 0; (int)tVar4 != (int)lVar7; lVar7 = lVar7 + 1) {
    *(float *)(lVar3 + lVar7 * 4) = fVar8;
    fVar8 = fVar8 + *(float *)(lVar5 + 0x3c);
  }
  *(float *)(lVar5 + 0x34) = *(float *)(lVar5 + 0x38) + *(float *)(lVar5 + 0x34);
  *(int *)(lVar5 + 0x50) = iVar6 + -1;
LAB_0011925d:
  return w + 4;
}

Assistant:

static t_int *line_tilde_perf8(t_int *w)
{
    t_line *x = (t_line *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample f = x->x_value;

    if (PD_BIGORSMALL(f))
        x->x_value = f = 0;
    if (x->x_retarget)
    {
        int nticks = x->x_inletwas * x->x_dspticktomsec;
        if (!nticks) nticks = 1;
        x->x_ticksleft = nticks;
        x->x_biginc = (x->x_target - x->x_value)/(t_sample)nticks;
        x->x_inc = x->x_1overn * x->x_biginc;
        x->x_retarget = 0;
    }
    if (x->x_ticksleft)
    {
        t_sample f = x->x_value;
        while (n--) *out++ = f, f += x->x_inc;
        x->x_value += x->x_biginc;
        x->x_ticksleft--;
    }
    else
    {
        t_sample f = x->x_value = x->x_target;
        for (; n; n -= 8, out += 8)
        {
            out[0] = f; out[1] = f; out[2] = f; out[3] = f;
            out[4] = f; out[5] = f; out[6] = f; out[7] = f;
        }
    }
    return (w+4);
}